

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

StringTree * __thiscall
capnp::compiler::stringLiteralStringTree
          (StringTree *__return_storage_ptr__,compiler *this,StringPtr chars)

{
  char *in_R8;
  undefined1 local_51 [17];
  String local_40;
  kj local_21;
  undefined1 local_20 [8];
  StringPtr chars_local;
  
  chars_local.content.ptr = chars.content.ptr;
  local_21 = (kj)0x22;
  local_20 = (undefined1  [8])this;
  chars_local.content.size_ = (size_t)__return_storage_ptr__;
  local_51._1_16_ =
       (undefined1  [16])kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)local_20);
  kj::encodeCEscape(&local_40,(ArrayPtr<const_char>)local_51._1_16_);
  local_51[0] = 0x22;
  kj::strTree<char,kj::String,char>
            (__return_storage_ptr__,&local_21,(char *)&local_40,(String *)local_51,in_R8);
  kj::String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree stringLiteralStringTree(kj::StringPtr chars) {
  return kj::strTree('"', kj::encodeCEscape(chars), '"');
}